

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_declaration.c
# Opt level: O0

void parse_declaration(Translation_Data *translation_data,Scope *scope,Queue *where_to_push,
                      char parse_function_definitions)

{
  char cVar1;
  Denotation_Prototype *prototype_00;
  Denoted_Function *function;
  AST_Compound_Statement *pAVar2;
  AST_Function_Definition *data;
  AST_Function_Declaration *data_00;
  AST_Type_Definition *data_01;
  AST_Object_Declaration *data_02;
  AST *pAVar3;
  AST_Declaration_Error *pAVar4;
  Denoted *hold;
  Denotation_Prototype *prototype;
  char parse_function_definitions_local;
  Queue *where_to_push_local;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  prototype_00 = parse_declaration_specifiers(translation_data,scope);
  prototype._7_1_ = parse_function_definitions;
  do {
    cVar1 = get_and_check(translation_data,KW_SEMI_COLUMN);
    if (cVar1 != '\0') goto LAB_001415b3;
    function = (Denoted_Function *)parse_declarator(translation_data,scope,prototype_00);
    if (function->denotation == DT_Function) {
      if ((prototype._7_1_ != '\0') &&
         (cVar1 = get_and_check(translation_data,KW_OPEN_CURLY), cVar1 != '\0')) {
        pAVar2 = (AST_Compound_Statement *)parse_finish_compound_statement(translation_data,scope);
        function->body = pAVar2;
        data = get_function_definition_tree(scope,function);
        Queue_Push(where_to_push,data);
        Scope_Push(scope,(Denoted *)function,translation_data);
        goto LAB_001415b3;
      }
      data_00 = get_function_declaration_tree(scope,function);
      Queue_Push(where_to_push,data_00);
    }
    else if (function->denotation == DT_Typedef) {
      data_01 = get_type_definition_tree((Denoted_Typedef *)function);
      Queue_Push(where_to_push,data_01);
    }
    else {
      if (function->denotation != DT_Object) {
        pAVar4 = get_declaration_error_tree((Denoted *)function);
        Queue_Push(where_to_push,pAVar4);
        push_translation_error("declaration expected",translation_data);
        goto LAB_001415b3;
      }
      data_02 = get_object_declaration_tree((Denoted_Object *)function);
      Queue_Push(where_to_push,data_02);
      cVar1 = get_and_check(translation_data,KW_EQ);
      if (cVar1 != '\0') {
        pAVar3 = parse_initializer(translation_data,scope,(Denoted_Object *)function);
        *(AST **)&function->function_specifier = pAVar3;
      }
    }
    Scope_Push(scope,(Denoted *)function,translation_data);
    prototype._7_1_ = '\0';
    cVar1 = get_and_check(translation_data,KW_COMMA);
  } while ((cVar1 != '\0') || (cVar1 = check(translation_data,KW_SEMI_COLUMN,0), cVar1 != '\0'));
  pAVar4 = get_declaration_error_tree((Denoted *)0x0);
  Queue_Push(where_to_push,pAVar4);
  push_translation_error("semi column expected",translation_data);
LAB_001415b3:
  free(prototype_00);
  return;
}

Assistant:

void parse_declaration(struct Translation_Data *translation_data,struct Scope *scope,struct Queue *where_to_push,char parse_function_definitions)
{
	struct Denotation_Prototype *prototype;
	struct Denoted *hold;

	prototype=parse_declaration_specifiers(translation_data,scope);
	while(!get_and_check(translation_data,KW_SEMI_COLUMN))
	{
		hold=parse_declarator(translation_data,scope,prototype);

		if(hold->denotation==DT_Function)
		{
			/*check if this is a function definition*/
			if(parse_function_definitions && get_and_check(translation_data,KW_OPEN_CURLY))
			{
				((struct Denoted_Function*)hold) ->body=
				       	(struct AST_Compound_Statement*)parse_finish_compound_statement(translation_data,scope);
				Queue_Push(where_to_push,get_function_definition_tree(scope,(struct Denoted_Function*)hold));
				Scope_Push(scope,hold,translation_data);
				break;
			}
			/*this is a function declaration*/
			Queue_Push(where_to_push,get_function_declaration_tree(scope,(struct Denoted_Function*)hold));
		}else if(hold->denotation==DT_Typedef)
		{
			Queue_Push(where_to_push,get_type_definition_tree((struct Denoted_Typedef*)hold));
		}else if(hold->denotation==DT_Object)
		{
			Queue_Push(where_to_push,get_object_declaration_tree((struct Denoted_Object*)hold));
			if(get_and_check(translation_data,KW_EQ))
				((struct Denoted_Object*)hold)->initializer=parse_initializer(translation_data,scope,(struct Denoted_Object*)hold);
		}else
		{
			/*TODO error*/
			Queue_Push(where_to_push,get_declaration_error_tree(hold));
			push_translation_error("declaration expected",translation_data);

			/*search for end of erronous declaration*/
			break;
		}

		Scope_Push(scope,hold,translation_data);
		parse_function_definitions=0;
		if(!get_and_check(translation_data,KW_COMMA) && !check(translation_data,KW_SEMI_COLUMN,0))
		{
			/*TODO error*/
			Queue_Push(where_to_push,get_declaration_error_tree(NULL));
			push_translation_error("semi column expected",translation_data);
			break;
		}
	}

	free(prototype);

}